

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O1

void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *p,int iGrp1,int iGrp2)

{
  char **ppcVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  
  if ((iGrp1 < 1) || (iVar3 = p->nCols + -1, iVar3 <= iGrp1)) {
    __assert_fail("iGrp1 >= 1 && iGrp1 < p->nCols - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Cluster.c"
                  ,0xe3,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
  }
  if ((0 < iGrp2) && (iGrp2 < iVar3)) {
    if (p->pColGrps[(uint)iGrp1] == (Llb_Grp_t *)0x0) {
      __assert_fail("p->pColGrps[iGrp1] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Cluster.c"
                    ,0xe5,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
    }
    if (p->pColGrps[(uint)iGrp2] != (Llb_Grp_t *)0x0) {
      if (0 < p->nRows) {
        lVar4 = 0;
        do {
          ppcVar1 = p->pMatrix;
          pcVar2 = ppcVar1[(uint)iGrp1];
          if ((pcVar2[lVar4] == '\x01') && (ppcVar1[(uint)iGrp2][lVar4] == '\x01')) {
            p->pRowSums[lVar4] = p->pRowSums[lVar4] + -1;
          }
          if ((pcVar2[lVar4] == '\0') && (ppcVar1[(uint)iGrp2][lVar4] == '\x01')) {
            pcVar2[lVar4] = '\x01';
            p->pColSums[(uint)iGrp1] = p->pColSums[(uint)iGrp1] + 1;
          }
          if (p->pMatrix[(uint)iGrp2][lVar4] == '\x01') {
            p->pMatrix[(uint)iGrp2][lVar4] = '\0';
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < p->nRows);
      }
      p->pColSums[(uint)iGrp2] = 0;
      return;
    }
    __assert_fail("p->pColGrps[iGrp2] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Cluster.c"
                  ,0xe6,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
  }
  __assert_fail("iGrp2 >= 1 && iGrp2 < p->nCols - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Cluster.c"
                ,0xe4,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
}

Assistant:

void Llb_MtrCombineSelectedColumns( Llb_Mtr_t * p, int iGrp1, int iGrp2 )
{
    int iVar;
    assert( iGrp1 >= 1 && iGrp1 < p->nCols - 1 );
    assert( iGrp2 >= 1 && iGrp2 < p->nCols - 1 );
    assert( p->pColGrps[iGrp1] != NULL );
    assert( p->pColGrps[iGrp2] != NULL );
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pMatrix[iGrp1][iVar] == 1 && p->pMatrix[iGrp2][iVar] == 1 )
            p->pRowSums[iVar]--;
        if ( p->pMatrix[iGrp1][iVar] == 0 && p->pMatrix[iGrp2][iVar] == 1 )
        {
            p->pMatrix[iGrp1][iVar] = 1;
            p->pColSums[iGrp1]++;
        }
        if ( p->pMatrix[iGrp2][iVar] == 1 )
            p->pMatrix[iGrp2][iVar] = 0;
    }
    p->pColSums[iGrp2] = 0;
}